

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_core.c
# Opt level: O1

int asterism_core_prepare(asterism_s *as)

{
  asterism_slist *paVar1;
  asterism_str s;
  asterism_str s_00;
  asterism_str s_01;
  asterism_s *as_00;
  int iVar2;
  int iVar3;
  uv_loop_t *puVar4;
  char *ip;
  check_timer_s *__s;
  asterism_slist *paVar5;
  uint uVar6;
  bool bVar7;
  asterism_str aVar8;
  uint port;
  asterism_str host;
  asterism_host_type host_type;
  asterism_str scheme;
  uint local_64;
  asterism_s *local_60;
  asterism_str local_58;
  asterism_host_type local_44;
  asterism_str local_40;
  
  puVar4 = uv_loop_new();
  as->loop = puVar4;
  if (as->idle_timeout == 0) {
    as->idle_timeout = 0x3c;
  }
  if (as->reconnect_delay == 0) {
    as->reconnect_delay = 10000;
  }
  if (as->heartbeart_interval == 0) {
    as->heartbeart_interval = 30000;
  }
  _global_proto_ping.len = 0x400;
  _global_proto_pong.len = 0x400;
  as->conns_queue[0] = as->conns_queue;
  as->conns_queue[1] = as->conns_queue;
  paVar5 = as->inner_bind_addrs;
  local_60 = as;
  if (paVar5 != (asterism_slist *)0x0) {
    do {
      paVar1 = paVar5->next;
      bVar7 = false;
      local_40.len = 0;
      local_58.len = 0;
      iVar2 = asterism_parse_address(paVar5->data,&local_40,&local_58,&local_64,&local_44);
      if (iVar2 == 0) {
        iVar2 = asterism_str_empty(&local_40);
        iVar3 = 7;
        if (iVar2 == 0) {
          iVar2 = asterism_vcasecmp(&local_40,"http");
          if (iVar2 == 0) {
            aVar8.len = local_58.len;
            aVar8.p = local_58.p;
            aVar8 = asterism_strdup_nul(aVar8);
            ip = aVar8.p;
            iVar3 = asterism_inner_http_init(local_60,ip,&local_64);
          }
          else {
            iVar2 = asterism_vcasecmp(&local_40,"socks5");
            if (iVar2 != 0) goto LAB_0010b783;
            s.len = local_58.len;
            s.p = local_58.p;
            aVar8 = asterism_strdup_nul(s);
            ip = aVar8.p;
            iVar3 = asterism_inner_socks5_init(local_60,ip,&local_64);
          }
          free(ip);
          bVar7 = iVar3 == 0;
          if (bVar7) {
            bVar7 = true;
            paVar5 = paVar1;
          }
        }
        else {
LAB_0010b783:
          bVar7 = false;
        }
      }
      else {
        iVar3 = 5;
      }
      if (!bVar7) {
        return iVar3;
      }
    } while (paVar1 != (asterism_slist *)0x0);
  }
  if (local_60->outer_bind_addr != (char *)0x0) {
    bVar7 = false;
    local_40.len = 0;
    local_58.len = 0;
    iVar2 = asterism_parse_address
                      (local_60->outer_bind_addr,&local_40,&local_58,&local_64,&local_44);
    if (iVar2 == 0) {
      iVar2 = asterism_vcasecmp(&local_40,"tcp");
      if ((iVar2 == 0) || (iVar2 = asterism_str_empty(&local_40), iVar2 != 0)) {
        s_00.len = local_58.len;
        s_00.p = local_58.p;
        aVar8 = asterism_strdup_nul(s_00);
        iVar2 = asterism_outer_tcp_init(local_60,aVar8.p,&local_64);
        free(aVar8.p);
        bVar7 = iVar2 == 0;
      }
      else {
        iVar2 = 7;
        bVar7 = false;
      }
    }
    else {
      iVar2 = 5;
    }
    if (!bVar7) {
      return iVar2;
    }
  }
  as_00 = local_60;
  if (local_60->connect_addr == (char *)0x0) goto LAB_0010b92a;
  bVar7 = false;
  local_40.len = 0;
  local_58.len = 0;
  iVar2 = 6;
  if (local_60->username != (char *)0x0) {
    if (local_60->password != (char *)0x0) {
      iVar2 = asterism_parse_address(local_60->connect_addr,&local_40,&local_58,&local_64,&local_44)
      ;
      if (iVar2 == 0) {
        iVar2 = asterism_vcasecmp(&local_40,"tcp");
        if ((iVar2 == 0) || (iVar2 = asterism_str_empty(&local_40), iVar2 != 0)) {
          s_01.len = local_58.len;
          s_01.p = local_58.p;
          aVar8 = asterism_strdup_nul(s_01);
          iVar2 = asterism_connector_tcp_init(as_00,aVar8.p,local_64);
          free(aVar8.p);
          bVar7 = iVar2 == 0;
          goto LAB_0010b926;
        }
        iVar2 = 7;
      }
      else {
        iVar2 = 5;
      }
    }
    bVar7 = false;
  }
LAB_0010b926:
  if (!bVar7) {
    return iVar2;
  }
LAB_0010b92a:
  __s = (check_timer_s *)malloc(0xa8);
  memset(__s,0,0xa8);
  local_60->check_timer = __s;
  (__s->timer).data = __s;
  __s->close = check_timer_close;
  __s->as = local_60;
  iVar2 = uv_timer_init(local_60->loop,&__s->timer);
  uVar6 = 1;
  if (iVar2 == 0) {
    iVar2 = uv_timer_start(&local_60->check_timer->timer,check_timer_cb,1000,1000);
    uVar6 = (uint)(iVar2 != 0);
  }
  return uVar6;
}

Assistant:

int asterism_core_prepare(struct asterism_s *as)
{
    int ret = ASTERISM_E_OK;
    as->loop = uv_loop_new();
    if (as->idle_timeout == 0) {
        as->idle_timeout = ASTERISM_CONNECTION_MAX_IDLE_COUNT;
    }
    if (as->reconnect_delay == 0) {
        as->reconnect_delay = ASTERISM_RECONNECT_DELAY;
    }
    if (as->heartbeart_interval == 0) {
        as->heartbeart_interval = ASTERISM_HEARTBEART_INTERVAL;
    }
    _global_proto_ping.len = htons(sizeof(_global_proto_ping));
    _global_proto_pong.len = htons(sizeof(_global_proto_pong));

    QUEUE_INIT(&as->conns_queue);

    struct asterism_slist *next;
    struct asterism_slist *item;
    if (as->inner_bind_addrs) {
        item = as->inner_bind_addrs;
        do
        {
            next = item->next;
            char *inner_bind_addr = item->data;
            struct asterism_str scheme;
            struct asterism_str host;
            unsigned int port;
            asterism_host_type host_type;
            scheme.len = 0;
            host.len = 0;
            int ret_addr = asterism_parse_address(inner_bind_addr, &scheme, &host, &port, &host_type);
            if (ret_addr)
            {
                ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
                goto cleanup;
            }
            if (asterism_str_empty(&scheme))
            {
                ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
                goto cleanup;
            }
            if (asterism_vcasecmp(&scheme, "http") == 0)
            {
                struct asterism_str __host = asterism_strdup_nul(host);
                ret = asterism_inner_http_init(as, __host.p, &port);
                AS_FREE((char *)__host.p);
                if (ret)
                    goto cleanup;
            }
            else if (asterism_vcasecmp(&scheme, "socks5") == 0)
            {
                struct asterism_str __host = asterism_strdup_nul(host);
                ret = asterism_inner_socks5_init(as, __host.p, &port);
                AS_FREE((char *)__host.p);
                if (ret)
                    goto cleanup;
            }
            else
            {
                ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
                goto cleanup;
            }
            item = next;
        } while (next);
    }

    if (as->outer_bind_addr)
    {
        struct asterism_str scheme;
        struct asterism_str host;
        unsigned int port;
        asterism_host_type host_type;
        scheme.len = 0;
        host.len = 0;
        int ret_addr = asterism_parse_address(as->outer_bind_addr, &scheme, &host, &port, &host_type);
        if (ret_addr)
        {
            ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
            goto cleanup;
        }
        if (asterism_vcasecmp(&scheme, "tcp") && !asterism_str_empty(&scheme))
        {
            ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
            goto cleanup;
        }
        struct asterism_str __host = asterism_strdup_nul(host);
        ret = asterism_outer_tcp_init(as, __host.p, &port);
        AS_FREE((char *)__host.p);
        if (ret)
            goto cleanup;
    }
    if (as->connect_addr)
    {
        struct asterism_str scheme;
        struct asterism_str host;
        unsigned int port;
        asterism_host_type host_type;
        scheme.len = 0;
        host.len = 0;
        if (!as->username || !as->password)
        {
            ret = ASTERISM_E_USERPASS_EMPTY;
            goto cleanup;
        }
        int ret_addr = asterism_parse_address(as->connect_addr, &scheme, &host, &port, &host_type);
        if (ret_addr)
        {
            ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
            goto cleanup;
        }
        if (asterism_vcasecmp(&scheme, "tcp") && !asterism_str_empty(&scheme))
        {
            ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
            goto cleanup;
        }
        struct asterism_str __host = asterism_strdup_nul(host);
        ret = asterism_connector_tcp_init(as, __host.p, port);
        AS_FREE((char *)__host.p);
        if (ret)
            goto cleanup;
    }

    as->check_timer = AS_ZMALLOC(struct check_timer_s);
    ASTERISM_HANDLE_INIT(as->check_timer, timer, check_timer_close);
    as->check_timer->as = as;
    ret = uv_timer_init(as->loop, &as->check_timer->timer);
    if (ret != 0)
    {
        ret = ASTERISM_E_FAILED;
        goto cleanup;
    }
    ret = uv_timer_start(&as->check_timer->timer, check_timer_cb, 1 * 1000, 1 * 1000);
    if (ret != 0)
    {
        ret = ASTERISM_E_FAILED;
        goto cleanup;
    }
cleanup:
    return ret;
}